

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void __thiscall
rtosc::ClonePorts::ClonePorts(ClonePorts *this,Ports *ports_,initializer_list<rtosc::ClonePort> c)

{
  iterator pCVar1;
  pointer pPVar2;
  char *__s2;
  int iVar3;
  uint uVar4;
  iterator pCVar5;
  Port *p;
  pointer pPVar6;
  pointer pPVar7;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  Port local_68;
  
  pCVar5 = c._M_array;
  Ports::Ports(&this->super_Ports,(initializer_list<rtosc::Port>)ZEXT816(0));
  if (c._M_len != 0) {
    pCVar1 = pCVar5 + c._M_len;
    do {
      pPVar6 = (ports_->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl
               .super__Vector_impl_data._M_start;
      pPVar2 = (ports_->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pPVar6 == pPVar2) {
LAB_001056a4:
        uVar4 = (byte)*pCVar5->name - 0x2a;
        if (uVar4 == 0) {
          uVar4 = (uint)(byte)pCVar5->name[1];
        }
        if (uVar4 != 0) {
          fprintf(_stderr,"Cannot find a clone port for \'%s\'\n");
        }
        std::function<void_(const_char_*,_rtosc::RtData_&)>::operator=
                  (&(this->super_Ports).default_handler,&pCVar5->cb);
      }
      else {
        __s2 = pCVar5->name;
        pPVar7 = (pointer)0x0;
        do {
          iVar3 = strcmp(pPVar6->name,__s2);
          if (iVar3 == 0) {
            pPVar7 = pPVar6;
          }
          pPVar6 = pPVar6 + 1;
        } while (pPVar6 != pPVar2);
        if (pPVar7 == (pointer)0x0) goto LAB_001056a4;
        local_68.name = pPVar7->name;
        local_68.metadata = pPVar7->metadata;
        local_68.ports = pPVar7->ports;
        std::function<void_(const_char_*,_rtosc::RtData_&)>::function(&local_68.cb,&pCVar5->cb);
        std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::emplace_back<rtosc::Port>
                  ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)this,&local_68);
        if (local_68.cb.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_68.cb.super__Function_base._M_manager)
                    ((_Any_data *)&local_68.cb,(_Any_data *)&local_68.cb,__destroy_functor);
        }
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != pCVar1);
  }
  Ports::refreshMagic(&this->super_Ports);
  return;
}

Assistant:

ClonePorts::ClonePorts(const Ports &ports_,
        std::initializer_list<ClonePort> c)
    :Ports({})
{
    for(auto &to_clone:c) {
        const Port *clone_port = NULL;
        for(auto &p:ports_.ports)
            if(!strcmp(p.name, to_clone.name))
                clone_port = &p;
        if(!clone_port && strcmp("*", to_clone.name)) {
            fprintf(stderr, "Cannot find a clone port for '%s'\n",to_clone.name);
            assert(false);
        }

        if(clone_port) {
            ports.push_back({clone_port->name, clone_port->metadata,
                    clone_port->ports, to_clone.cb});
        } else {
            default_handler = to_clone.cb;
        }
    }

    refreshMagic();
}